

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall sf::Text::Text(Text *this,String *string,Font *font,uint characterSize)

{
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_002905e8;
  Transformable::Transformable(&this->super_Transformable);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Text_00290830;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Text_00290858;
  String::String(&this->m_string,string);
  this->m_font = font;
  this->m_characterSize = characterSize;
  this->m_letterSpacingFactor = 1.0;
  this->m_lineSpacingFactor = 1.0;
  this->m_style = 0;
  Color::Color(&this->m_fillColor,0xff,0xff,0xff,0xff);
  Color::Color(&this->m_outlineColor,'\0','\0','\0',0xff);
  this->m_outlineThickness = 0.0;
  VertexArray::VertexArray(&this->m_vertices,Triangles,0);
  VertexArray::VertexArray(&this->m_outlineVertices,Triangles,0);
  (this->m_bounds).left = 0.0;
  (this->m_bounds).top = 0.0;
  (this->m_bounds).width = 0.0;
  (this->m_bounds).height = 0.0;
  this->m_geometryNeedUpdate = true;
  this->m_fontTextureId = 0;
  return;
}

Assistant:

Text::Text(const String& string, const Font& font, unsigned int characterSize) :
m_string             (string),
m_font               (&font),
m_characterSize      (characterSize),
m_letterSpacingFactor(1.f),
m_lineSpacingFactor  (1.f),
m_style              (Regular),
m_fillColor          (255, 255, 255),
m_outlineColor       (0, 0, 0),
m_outlineThickness   (0),
m_vertices           (Triangles),
m_outlineVertices    (Triangles),
m_bounds             (),
m_geometryNeedUpdate (true),
m_fontTextureId      (0)
{

}